

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall gimage::Histogram::setSize(Histogram *this,int width,int height,int binsize)

{
  unsigned_long *puVar1;
  unsigned_long **ppuVar2;
  ulong uVar3;
  
  if ((this->w != width) || (this->h != height)) {
    if (this->val != (unsigned_long *)0x0) {
      operator_delete__(this->val);
    }
    if (this->row != (unsigned_long **)0x0) {
      operator_delete__(this->row);
    }
    this->w = width;
    this->h = height;
    this->val = (unsigned_long *)0x0;
    this->row = (unsigned_long **)0x0;
    if (0 < height && 0 < width) {
      puVar1 = (unsigned_long *)operator_new__((ulong)(uint)(height * width) << 3);
      this->val = puVar1;
      ppuVar2 = (unsigned_long **)operator_new__((ulong)(uint)height * 8);
      this->row = ppuVar2;
      *ppuVar2 = puVar1;
      for (uVar3 = 1; (uint)height != uVar3; uVar3 = uVar3 + 1) {
        this->row[uVar3] = this->row[uVar3 - 1] + (uint)width;
      }
    }
  }
  this->bs = binsize;
  return;
}

Assistant:

void Histogram::setSize(int width, int height, int binsize)
{
  if (w != width || h != height)
  {
    delete [] val;
    delete [] row;

    w=width;
    h=height;
    val=0;
    row=0;

    if (w > 0 && h > 0)
    {
      val=new unsigned long [w*h];
      row=new unsigned long * [h];

      row[0]=val;

      for (int k=1; k<h; k++)
      {
        row[k]=row[k-1]+w;
      }
    }
  }

  bs=binsize;
}